

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall
GdlRenderer::RecordSingleMemberClasses
          (GdlRenderer *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *vstaSingleMemberClasses,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *vstaFiles,vector<int,_std::allocator<int>_> *vnLines,string *staPathToCur)

{
  pointer ppGVar1;
  GdlGlyphClassDefn *this_00;
  ulong uVar2;
  string local_50;
  
  for (uVar2 = 0;
      ppGVar1 = (this->m_vpglfc).
                super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->m_vpglfc).
                            super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar1 >> 3);
      uVar2 = uVar2 + 1) {
    this_00 = ppGVar1[uVar2];
    std::__cxx11::string::string((string *)&local_50,(string *)staPathToCur);
    GdlGlyphClassDefn::RecordSingleMemberClasses
              (this_00,vstaSingleMemberClasses,vstaFiles,vnLines,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void GdlRenderer::RecordSingleMemberClasses(std::vector<std::string> & vstaSingleMemberClasses,
	std::vector<std::string> & vstaFiles, std::vector<int> & vnLines, std::string staPathToCur)
{
	for (size_t ipglfc = 0; ipglfc < m_vpglfc.size(); ipglfc++)
	{
		m_vpglfc[ipglfc]->RecordSingleMemberClasses(vstaSingleMemberClasses, vstaFiles, vnLines,
			staPathToCur);
	}
}